

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNArg::gen_code(CTPNArg *this,int param_2,int param_3)

{
  CTcPrsNode *pCVar1;
  CTPNArgBase *in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  pCVar1 = CTPNArgBase::get_arg_expr(in_RDI);
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,0);
  if ((in_RDI->field_0x40 & 1) != 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcGenTarg::note_push((CTcGenTarg *)0x281bcf);
    CTcGenTarg::note_pop((CTcGenTarg *)0x281bde);
  }
  return;
}

Assistant:

void CTPNArg::gen_code(int, int)
{
    /* 
     *   Generate the argument expression.  We need the value (hence
     *   discard = false), and we need the assignable value (hence
     *   for_condition = false). 
     */
    get_arg_expr()->gen_code(FALSE, FALSE);

    /* 
     *   if this is a list-to-varargs conversion, generate the conversion
     *   instruction 
     */
    if (is_varargs_)
    {
        /* write the opcode */
        G_cg->write_op(OPC_MAKELSTPAR);

        /* note the extra push and pop for the argument count */
        G_cg->note_push();
        G_cg->note_pop();
    }
}